

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registration.c
# Opt level: O2

int registration_service_init(registration_service_handle *rs)

{
  int iVar1;
  void *pvVar2;
  
  pvVar2 = rs->priv;
  if (pvVar2 == (void *)0x0) {
    pvVar2 = calloc(1,0x60);
    if (pvVar2 == (void *)0x0) {
      return -0xc;
    }
    rs->priv = pvVar2;
  }
  iVar1 = mutex_init((mutex_handle *)((long)pvVar2 + 0x20));
  if (iVar1 == 0) {
    *(registration_service_handle **)((long)pvVar2 + 0x38) = rs;
    *(code **)((long)pvVar2 + 0x30) = registration_func;
    *(undefined8 *)((long)pvVar2 + 0x40) = 0x927c000100000;
    iVar1 = worker_init((worker_handle *)((long)pvVar2 + 0x28));
    if (iVar1 == 0) {
      if (*(int *)((long)pvVar2 + 0x58) != 3) {
        return 0;
      }
      *(undefined4 *)((long)pvVar2 + 0x58) = 0;
      return 0;
    }
  }
  worker_free((worker_handle *)((long)pvVar2 + 0x28));
  mutex_free((mutex_handle *)((long)pvVar2 + 0x20));
  free(rs->priv);
  rs->priv = (void *)0x0;
  return iVar1;
}

Assistant:

int registration_service_init(struct registration_service_handle *rs)
{
	struct registration_service_priv *priv = rs->priv;
	int ret;

	if (priv == NULL) {
		priv = calloc(1, sizeof(*priv));
		if (priv == NULL)
			return -ENOMEM;

		rs->priv = priv;
	}

	ret = mutex_init(&priv->mutex);
	if (ret != 0)
		goto registration_service_init_exit;

	priv->worker.func_ctx = rs;
	priv->worker.func_ptr = registration_func;
	priv->worker.periodic_wake = UPDATE_INTERVAL;
	priv->worker.stack_size = 1024 * 1024;
	ret = worker_init(&priv->worker);
	if (ret != 0)
		goto registration_service_init_exit;

	if (priv->status == REGISTRATION_STATUS_OFF)
		priv->status = REGISTRATION_STATUS_UNKNOWN;

	return 0;

registration_service_init_exit:
	worker_free(&priv->worker);
	mutex_free(&priv->mutex);

	free(rs->priv);
	rs->priv = NULL;

	return ret;
}